

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KVStringPair.cpp
# Opt level: O0

void __thiscall xercesc_4_0::KVStringPair::serialize(KVStringPair *this,XSerializeEngine *serEng)

{
  bool bVar1;
  XMLSize_t local_20;
  XMLSize_t dataLen;
  XSerializeEngine *serEng_local;
  KVStringPair *this_local;
  
  dataLen = (XMLSize_t)serEng;
  serEng_local = (XSerializeEngine *)this;
  bVar1 = XSerializeEngine::isStoring(serEng);
  if (bVar1) {
    XSerializeEngine::writeString((XSerializeEngine *)dataLen,this->fKey,this->fKeyAllocSize,true);
    XSerializeEngine::writeString
              ((XSerializeEngine *)dataLen,this->fValue,this->fValueAllocSize,true);
  }
  else {
    local_20 = 0;
    XSerializeEngine::readString
              ((XSerializeEngine *)dataLen,&this->fKey,&this->fKeyAllocSize,&local_20,true);
    XSerializeEngine::readString
              ((XSerializeEngine *)dataLen,&this->fValue,&this->fValueAllocSize,&local_20,true);
  }
  return;
}

Assistant:

void KVStringPair::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {

        serEng.writeString(fKey,   fKeyAllocSize,   XSerializeEngine::toWriteBufferLen);
        serEng.writeString(fValue, fValueAllocSize, XSerializeEngine::toWriteBufferLen);
    }
    else
    {
        XMLSize_t dataLen = 0;
        serEng.readString(fKey,   fKeyAllocSize,   dataLen, XSerializeEngine::toReadBufferLen);
        serEng.readString(fValue, fValueAllocSize, dataLen, XSerializeEngine::toReadBufferLen);
    }

}